

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O0

string * AddEntityID(string *__return_storage_ptr__,string *s,uint64_t entity,string *prefix)

{
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar1;
  basic_formatter *this;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string *local_28;
  string *prefix_local;
  uint64_t entity_local;
  string *s_local;
  
  local_28 = prefix;
  prefix_local = (string *)entity;
  entity_local = (uint64_t)s;
  s_local = __return_storage_ptr__;
  if (entity == 0xffffffffffffffff) {
    std::operator+(__return_storage_ptr__,prefix,s);
  }
  else {
    Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter(&local_1a0);
    pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_1a0,local_28);
    pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator_(pbVar1,(char (*) [10])"(entity #");
    pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator_(pbVar1,(unsigned_long *)&prefix_local);
    pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator_(pbVar1,(char (*) [3])0xa7e5f6);
    this = (basic_formatter *)
           Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
           operator_(pbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            entity_local);
    Assimp::Formatter::basic_formatter::operator_cast_to_string(__return_storage_ptr__,this);
    Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AddEntityID(const std::string& s,uint64_t entity /*= ENTITY_NOT_SPECIFIED*/, const std::string& prefix = "")
{
    return entity == STEP::TypeError::ENTITY_NOT_SPECIFIED ? prefix+s : static_cast<std::string>( (Formatter::format(),prefix,"(entity #",entity,") ",s));
}